

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1d_parser.c
# Opt level: O0

RK_S32 av1_extract_obu(AV1OBU *obu,uint8_t *buf,RK_S32 length)

{
  RK_S32 RVar1;
  RK_S32 *spatial_id_00;
  RK_S32 local_40;
  RK_S32 len;
  RK_S32 spatial_id;
  RK_S32 temporal_id;
  RK_S32 type;
  RK_S32 start_pos;
  int64_t obu_size;
  uint8_t *puStack_20;
  RK_S32 length_local;
  uint8_t *buf_local;
  AV1OBU *obu_local;
  
  spatial_id_00 = &local_40;
  obu_size._4_4_ = length;
  puStack_20 = buf;
  buf_local = (uint8_t *)obu;
  RVar1 = parse_obu_header(buf,length,(int64_t *)&type,&temporal_id,&spatial_id,&len,spatial_id_00);
  if (-1 < RVar1) {
    *(RK_S32 *)(buf_local + 0x78) = spatial_id;
    *(RK_S32 *)(buf_local + 0x7c) = len;
    *(RK_S32 *)(buf_local + 0x80) = local_40;
    *(uint8_t **)(buf_local + 8) = puStack_20 + temporal_id;
    *(RK_S32 *)buf_local = type;
    *(uint8_t **)(buf_local + 0x18) = puStack_20;
    *(RK_S32 *)(buf_local + 0x14) = RVar1;
    if ((av1d_debug & 8) != 0) {
      _mpp_log_l(4,"av1d_parser","obu_type: %d, temporal_id: %d, spatial_id: %d, payload size: %d\n"
                 ,"av1_extract_obu",(ulong)*(uint *)(buf_local + 0x78),
                 (ulong)*(uint *)(buf_local + 0x7c),
                 CONCAT44((int)((ulong)spatial_id_00 >> 0x20),*(undefined4 *)(buf_local + 0x80)),
                 *(undefined4 *)buf_local);
    }
  }
  return RVar1;
}

Assistant:

RK_S32 av1_extract_obu(AV1OBU *obu, uint8_t *buf, RK_S32 length)
{
    int64_t obu_size;
    RK_S32 start_pos, type, temporal_id, spatial_id;
    RK_S32 len;

    len = parse_obu_header(buf, length, &obu_size, &start_pos,
                           &type, &temporal_id, &spatial_id);
    if (len < 0)
        return len;

    obu->type        = type;
    obu->temporal_id = temporal_id;
    obu->spatial_id  = spatial_id;

    obu->data     = buf + start_pos;
    obu->size     = obu_size;
    obu->raw_data = buf;
    obu->raw_size = len;

    av1d_dbg(AV1D_DBG_STRMIN, "obu_type: %d, temporal_id: %d, spatial_id: %d, payload size: %d\n",
             obu->type, obu->temporal_id, obu->spatial_id, obu->size);

    return len;
}